

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImStb::STB_TEXTEDIT_LAYOUTROW(StbTexteditRow *r,ImGuiInputTextState *obj,int line_start_idx)

{
  ImWchar *text_begin;
  ImDrawIdx *pIVar1;
  bool in_R8B;
  ImVec2 IVar2;
  ImWchar *text_remaining;
  
  pIVar1 = (obj->TextW).Data;
  text_remaining = (ImWchar *)0x0;
  text_begin = pIVar1 + line_start_idx;
  IVar2 = InputTextCalcTextSizeW
                    (text_begin,pIVar1 + obj->CurLenW,&text_remaining,(ImVec2 *)0x1,in_R8B);
  r->x0 = 0.0;
  r->x1 = IVar2.x;
  r->baseline_y_delta = IVar2.y;
  r->ymin = 0.0;
  r->ymax = IVar2.y;
  r->num_chars = (int)((ulong)((long)text_remaining - (long)text_begin) >> 1);
  return;
}

Assistant:

static void    STB_TEXTEDIT_LAYOUTROW(StbTexteditRow* r, ImGuiInputTextState* obj, int line_start_idx)
{
    const ImWchar* text = obj->TextW.Data;
    const ImWchar* text_remaining = NULL;
    const ImVec2 size = InputTextCalcTextSizeW(text + line_start_idx, text + obj->CurLenW, &text_remaining, NULL, true);
    r->x0 = 0.0f;
    r->x1 = size.x;
    r->baseline_y_delta = size.y;
    r->ymin = 0.0f;
    r->ymax = size.y;
    r->num_chars = (int)(text_remaining - (text + line_start_idx));
}